

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O1

void kObjectProto_SetObject(KonohaContext *kctx,void *ao,ksymbol_t key,ktypeattr_t ty,void *val)

{
  undefined8 *puVar1;
  KKeyValue kvs;
  KKeyValue local_28;
  
  local_28.typeAttr = ty | 0x80000000;
  local_28.key = key;
  local_28.field_2 = (anon_union_8_4_5585e3e3_for_KKeyValue_2)val;
  if (*(long *)((long)ao + 0x10) == 0) {
    puVar1 = (undefined8 *)(*(kctx->platApi->GCModule).Kzmalloc)(kctx,0x30,(KTraceInfo *)0x0);
    *puVar1 = 1;
    (*kctx->klib->KArray_Init)(kctx,(KGrowingArray *)(puVar1 + 2),0x40);
    *(undefined8 **)((long)ao + 0x10) = puVar1;
  }
  KDict_Set(kctx,(KDict *)(*(long *)((long)ao + 0x10) + 0x10),&local_28);
  (*(kctx->platApi->GCModule).WriteBarrier)(kctx,(kObjectVar *)ao);
  return;
}

Assistant:

static void kObjectProto_SetObject(KonohaContext *kctx, kAbstractObject *ao, ksymbol_t key, ktypeattr_t ty, kAbstractObject *val)
{
	kObjectVar *o = (kObjectVar *)ao;
	KKeyValue kvs = {key, ty | KTypeAttr_Boxed, {(uintptr_t)val}};
	if(KGetProtoMap(o) == NULL) {
		KSetProtoMap(o, new_KProtoMap(kctx));
	}
	KDict *dict = &(KGetProtoMap(o)->dict);
	KDict_Set(kctx, dict, &kvs);
	PLATAPI GCModule.WriteBarrier(kctx, o);
}